

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::reportError(Parser *this,shared_ptr<Token> *token,string *errorMessage)

{
  ostream *out;
  string local_60;
  __shared_ptr<Readable_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  allocator<char> local_29;
  
  out = this->out;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"syntactic analysis",&local_29);
  std::__shared_ptr<Readable_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Readable,void>
            (local_40,(__shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> *)
                      (((this->tokenBuffer).
                        super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      tokenizer).super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Error::reportErrorAtToken(out,&local_60,(shared_ptr<const_Readable> *)local_40,token,errorMessage)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void Parser::reportError(
    const std::shared_ptr<Token>& token,
    const std::string & errorMessage) noexcept {

  Error::reportErrorAtToken(
    this->out,
    "syntactic analysis",
    this->tokenBuffer->tokenizer->reader,
    token, errorMessage);
}